

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)20,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  u32 uVar3;
  StrWriter *pSVar4;
  UInt u;
  Av<(moira::Instr)20,_(moira::Mode)12,_2> *av;
  Av<(moira::Instr)20,_(moira::Mode)12,_2> local_20;
  Av<(moira::Instr)20,_(moira::Mode)12,_2> local_1c;
  
  uVar1 = *addr;
  uVar3 = dasmIncRead<2>(this,addr);
  u.raw = uVar1 + (int)(short)uVar3 + 2;
  SVar2 = str->style->syntax;
  if (SVar2 - GNU < 2) {
    pSVar4 = StrWriter::operator<<(str);
    pSVar4 = StrWriter::operator<<(pSVar4);
    StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar4,u);
    return;
  }
  if (SVar2 == MUSASHI) {
    pSVar4 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar4,u);
    av = &local_1c;
  }
  else {
    pSVar4 = StrWriter::operator<<(str);
    StrWriter::operator<<(pSVar4,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar4,u);
    av = &local_20;
  }
  av->ext1 = 0;
  StrWriter::operator<<(pSVar4,av);
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op) const
{
    u32 dst = addr;
    U32_INC(dst, 2);
    U32_INC(dst, S == Byte ? (i8)op : SEXT<S>(dasmIncRead<S>(addr)));

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            if (S == Byte && (u8)op == 0xFF) {

                dasmIllegal<I, M, S>(str, addr, op);
                break;
            }

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << Szb<S>{} << str.tab << UInt(dst);
            break;

        default:

            str << Ins<I>{} << str.tab << UInt(dst) << Av<I, M, S>{};
            break;
    }
}